

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv4Transmitter::AddLoopbackAddress(RTPUDPv4Transmitter *this)

{
  _List_node_base *p_Var1;
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar2;
  uint32_t loopbackaddr;
  value_type local_4;
  
  this_00 = &this->localIPs;
  bVar2 = false;
  p_Var1 = (_List_node_base *)this_00;
  while( true ) {
    if (bVar2) {
      return;
    }
    p_Var1 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) break;
    bVar2 = *(int *)&p_Var1[1]._M_next == 0x7f000001;
  }
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_4);
  return;
}

Assistant:

void RTPUDPv4Transmitter::AddLoopbackAddress()
{
	uint32_t loopbackaddr = (((uint32_t)127)<<24)|((uint32_t)1);
	std::list<uint32_t>::const_iterator it;
	bool found = false;
	
	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if (*it == loopbackaddr)
			found = true;
	}

	if (!found)
		localIPs.push_back(loopbackaddr);
}